

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLoader.c
# Opt level: O3

UINT32 DataLoader_Read(DATA_LOADER *loader,UINT32 numBytes)

{
  UINT8 UVar1;
  UINT32 UVar2;
  uint uVar3;
  UINT8 *pUVar4;
  UINT32 UVar5;
  
  UVar5 = 0;
  if (loader->_status == '\x01') {
    uVar3 = 0xffffffff;
    if (!CARRY4(numBytes,loader->_bytesLoaded)) {
      uVar3 = numBytes + loader->_bytesLoaded;
    }
    if (loader->_bytesTotal <= uVar3) {
      uVar3 = loader->_bytesTotal;
    }
    pUVar4 = (UINT8 *)realloc(loader->_data,(ulong)uVar3);
    loader->_data = pUVar4;
    if (((pUVar4 != (UINT8 *)0x0) &&
        (UVar2 = (*loader->_callbacks->dread)
                           (loader->_context,pUVar4 + loader->_bytesLoaded,
                            uVar3 - loader->_bytesLoaded), UVar2 != 0)) &&
       ((uVar3 = loader->_bytesLoaded + UVar2, loader->_bytesLoaded = uVar3, UVar5 = UVar2,
        loader->_bytesTotal <= uVar3 ||
        (UVar1 = (*loader->_callbacks->deof)(loader->_context), UVar1 != '\0')))) {
      if (loader->_status == '\x01') {
        (*loader->_callbacks->dclose)(loader->_context);
      }
      loader->_status = '\x02';
    }
  }
  return UVar5;
}

Assistant:

UINT32 DataLoader_Read(DATA_LOADER *loader, UINT32 numBytes)
{
	UINT32 endOfs;
	UINT32 readBytes;

	if (loader->_status != DLSTAT_LOADING)
		return 0;

	endOfs = loader->_bytesLoaded + numBytes;
	if (endOfs < loader->_bytesLoaded)
		endOfs = (UINT32)-1;
	if (endOfs > loader->_bytesTotal)
		endOfs = loader->_bytesTotal;

	loader->_data = (UINT8 *)realloc(loader->_data,endOfs);
	if(loader->_data == NULL) {
		return 0;
	}

	numBytes = endOfs - loader->_bytesLoaded;
	readBytes = loader->_callbacks->dread(loader->_context,&loader->_data[loader->_bytesLoaded],numBytes);
	if(!readBytes) return 0;
	loader->_bytesLoaded += readBytes;

	/* Note: The check (loaded >= total) is necessary, as the EoF flag is set only when
	         reading *beyond* the end of the file. Stopping at the last byte doesn't set it. */
	if (loader->_bytesLoaded >= loader->_bytesTotal || loader->_callbacks->deof(loader->_context))
	{
		DataLoader_CancelLoading(loader);
		loader->_status = DLSTAT_LOADED;
	}

	return readBytes;
}